

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrShareSpatialAnchorCompleteBD
                   (XrSenseDataProviderBD provider,XrFutureEXT future,
                   XrFutureCompletionEXT *completion)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_sensedataproviderbd_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  XrResult result;
  XrFutureCompletionEXT *completion_local;
  XrFutureEXT future_local;
  XrSenseDataProviderBD provider_local;
  
  pVar2 = HandleInfo<XrSenseDataProviderBD_T_*>::getWithInstanceInfo
                    (&g_sensedataproviderbd_info,provider);
  XVar1 = (*(pVar2.second)->dispatch_table->ShareSpatialAnchorCompleteBD)
                    (provider,future,completion);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrShareSpatialAnchorCompleteBD(
    XrSenseDataProviderBD provider,
    XrFutureEXT future,
    XrFutureCompletionEXT* completion) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_sensedataproviderbd_info.getWithInstanceInfo(provider);
        GenValidUsageXrHandleInfo *gen_sensedataproviderbd_info = info_with_instance.first;
        (void)gen_sensedataproviderbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->ShareSpatialAnchorCompleteBD(provider, future, completion);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}